

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O1

conversion_result mjs::unicode::utf8_to_utf32<char>(char *src,uint max_length)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (max_length == 0) {
    __assert_fail("max_length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                  ,0x24,
                  "conversion_result mjs::unicode::utf8_to_utf32(const CharT *, unsigned int) [CharT = char]"
                 );
  }
  bVar1 = *src;
  uVar2 = (ulong)bVar1;
  uVar3 = 1;
  uVar4 = (uint)bVar1;
  if ((((char)bVar1 < '\0') && (uVar3 = 2, (uVar4 & 0xffffffe0) != 0xc0)) &&
     (uVar3 = 3, (uVar4 & 0xfffffff0) != 0xe0)) {
    uVar3 = (uint)((uVar4 & 0xfffffff8) == 0xf0) << 2;
  }
  if (uVar3 - 1 < max_length) {
    uVar5 = 1;
    if (uVar3 != 1) {
      uVar4 = 0xfcU >> (sbyte)uVar3 & uVar4;
      if (uVar3 != 0) {
        do {
          if (((byte)src[uVar5] & 0xffffffc0) != 0x80) {
            uVar4 = 0;
            uVar3 = 0;
            break;
          }
          uVar4 = (byte)src[uVar5] & 0x3f | uVar4 << 6;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      uVar5 = (ulong)uVar3;
      uVar2 = (ulong)uVar4;
    }
  }
  else {
    uVar5 = 0;
    uVar2 = 0;
  }
  return (conversion_result)(uVar2 << 0x20 | uVar5);
}

Assistant:

constexpr conversion_result utf8_to_utf32(const CharT* src, unsigned max_length) {
    static_assert(sizeof(CharT) == 1);
    assert(max_length != 0);
    const auto first_code_unit = static_cast<uint8_t>(src[0]);
    const auto l = utf8_length_from_lead_code_unit(first_code_unit);
    if (!l) {
        // Invalid leading byte
        return invalid_conversion;
    } else if (l > max_length) {
        // Not enough source characters
        return invalid_conversion;
    } else if (l == 1) {
        // Simple case
        return { 1, first_code_unit };
    }
    char32_t code_point = first_code_unit & (0b1111'1100 >> l);
    for (unsigned i = 1; i < l; ++i) {
        const auto here = static_cast<uint8_t>(src[i]);
        if ((here & 0b1100'0000) != 0b1000'0000) {
            // Invalid continuation byte
            return invalid_conversion;
        }
        code_point <<= 6;
        code_point |= here & 0x3f;
    }
    
    return { l, code_point };
}